

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O1

Expr real_p(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
           int argc)

{
  _Bool value;
  char *__format;
  Expr EVar1;
  Expr expr;
  
  if (argc < 2) {
    if (argc == 1) {
      EVar1._4_4_ = 0;
      EVar1.type = args->type;
      EVar1.field_1.val_atom = (args->field_1).val_atom;
      EVar1 = exec_eval(exec,callContext,EVar1);
      expr._4_4_ = 0;
      expr.type = EVar1.type;
      expr.field_1.val_atom = EVar1.field_1.val_atom;
      value = is_real(expr);
      EVar1 = make_bool(exec,value);
      return EVar1;
    }
    __format = "%s: too few arguments\n";
  }
  else {
    __format = "%s: too many arguments\n";
  }
  printf(__format,"real?");
  exit(1);
}

Assistant:

Expr predicate_impl(pExecutor exec, pContext context, char *caller, Expr *args, int argc, _Bool (*p)(Expr))
{
    if (argc > 1)
    {
        logf("%s: too many arguments", caller);
        exit(1);
    }
    if (argc < 1)
    {
        logf("%s: too few arguments", caller);
        exit(1);
    }
    Expr value = exec_eval(exec, context, args[0]);
    return make_bool(exec, p(value));
}